

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::internal::anon_unknown_35::SplitEscapedString(string *str)

{
  char *pcVar1;
  ulong in_RSI;
  value_type *in_RDI;
  size_t i;
  bool escaped;
  size_t end;
  size_t start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  value_type *this;
  string local_88 [8];
  string local_58 [32];
  long local_38;
  byte local_29;
  ulong local_28;
  long local_20;
  undefined1 local_11;
  ulong local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13c120);
  local_20 = 0;
  local_28 = std::__cxx11::string::size();
  if (((2 < local_28) &&
      (pcVar1 = (char *)std::__cxx11::string::operator[](local_10), *pcVar1 == '\"')) &&
     (pcVar1 = (char *)std::__cxx11::string::operator[](local_10), *pcVar1 == '\"')) {
    local_20 = local_20 + 1;
    local_28 = local_28 - 1;
  }
  local_29 = 0;
  for (local_38 = local_20; local_38 + 1U < local_28; local_38 = local_38 + 1) {
    if ((local_29 & 1) == 0) {
      pcVar1 = (char *)std::__cxx11::string::operator[](local_10);
      local_29 = *pcVar1 == '\\';
    }
    else {
      local_29 = 0;
      pcVar1 = (char *)std::__cxx11::string::operator[](local_10);
      if (*pcVar1 == 'n') {
        std::__cxx11::string::substr((ulong)local_58,local_10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,in_RDI);
        std::__cxx11::string::~string(local_58);
        local_20 = local_38 + 1;
      }
    }
  }
  std::__cxx11::string::substr((ulong)local_88,local_10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,in_RDI);
  std::__cxx11::string::~string(local_88);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
}

Assistant:

std::vector<std::string> SplitEscapedString(const std::string& str) {
  std::vector<std::string> lines;
  size_t start = 0, end = str.size();
  if (end > 2 && str[0] == '"' && str[end - 1] == '"') {
    ++start;
    --end;
  }
  bool escaped = false;
  for (size_t i = start; i + 1 < end; ++i) {
    if (escaped) {
      escaped = false;
      if (str[i] == 'n') {
        lines.push_back(str.substr(start, i - start - 1));
        start = i + 1;
      }
    } else {
      escaped = str[i] == '\\';
    }
  }
  lines.push_back(str.substr(start, end - start));
  return lines;
}